

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QObject ** __thiscall
QHash<QObject_*,_QObject_*>::keyImpl(QHash<QObject_*,_QObject_*> *this,QObject **value)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  piter local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->d != (Data *)0x0) {
    local_28 = (piter)begin(this);
    while( true ) {
      if (local_28.d == (Data<QHashPrivate::Node<QObject_*,_QObject_*>_> *)0x0 &&
          local_28.bucket == 0) break;
      pSVar2 = (local_28.d)->spans;
      uVar4 = local_28.bucket >> 7;
      pEVar3 = pSVar2[uVar4].entries;
      bVar1 = pSVar2[uVar4].offsets[(uint)local_28.bucket & 0x7f];
      if (*(QObject **)(pEVar3[bVar1].storage.data + 8) == *value) {
        pEVar3 = pEVar3 + bVar1;
        goto LAB_0029d06b;
      }
      QHashPrivate::iterator<QHashPrivate::Node<QObject_*,_QObject_*>_>::operator++(&local_28);
    }
  }
  pEVar3 = (Entry *)0x0;
LAB_0029d06b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QObject **)pEVar3;
  }
  __stack_chk_fail();
}

Assistant:

const Key *keyImpl(const T &value) const noexcept
    {
        if (d) {
            const_iterator i = begin();
            while (i != end()) {
                if (i.value() == value)
                    return &i.key();
                ++i;
            }
        }

        return nullptr;
    }